

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::SeparatorEx(ImGuiSeparatorFlags flags)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  ImGuiGroupData *pIVar3;
  ImGuiTableColumn *pIVar4;
  uint in_EDI;
  bool item_visible;
  ImRect bb_1;
  ImGuiOldColumns *columns;
  ImGuiTable *table;
  float x2;
  float x1;
  ImRect bb;
  float y2;
  float y1;
  float thickness_layout;
  float thickness_draw;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined8 in_stack_ffffffffffffff40;
  ImGuiOldColumns *pIVar5;
  ImRect *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  ImVec2 *in_stack_ffffffffffffff88;
  ImGuiOldColumns *p1;
  ImDrawList *in_stack_ffffffffffffff90;
  ImGuiTable *this;
  float local_68;
  float local_64;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 in_stack_ffffffffffffffb0;
  ImVec2 in_stack_ffffffffffffffb8;
  ImVec2 in_stack_ffffffffffffffc0;
  ImRect local_38;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  ImGuiContext *local_18;
  
  pIVar2 = GetCurrentWindow();
  if ((pIVar2->SkipItems & 1U) == 0) {
    local_18 = GImGui;
    local_1c = 1.0;
    local_20 = 0.0;
    if ((in_EDI & 2) == 0) {
      if ((in_EDI & 1) != 0) {
        local_64 = (pIVar2->Pos).x;
        local_68 = (pIVar2->Pos).x + (pIVar2->Size).x;
        if ((0 < (GImGui->GroupStack).Size) &&
           (pIVar3 = ImVector<ImGuiGroupData>::back(&GImGui->GroupStack),
           pIVar3->WindowID == pIVar2->ID)) {
          local_64 = (pIVar2->DC).Indent.x + local_64;
        }
        this = local_18->CurrentTable;
        if (this != (ImGuiTable *)0x0) {
          pIVar4 = ImSpan<ImGuiTableColumn>::operator[](&this->Columns,this->CurrentColumn);
          local_64 = pIVar4->MinX;
          pIVar4 = ImSpan<ImGuiTableColumn>::operator[](&this->Columns,this->CurrentColumn);
          local_68 = pIVar4->MaxX;
        }
        if ((in_EDI & 4) == 0) {
          pIVar5 = (ImGuiOldColumns *)0x0;
        }
        else {
          pIVar5 = (pIVar2->DC).CurrentColumns;
        }
        p1 = pIVar5;
        if (pIVar5 != (ImGuiOldColumns *)0x0) {
          PushColumnsBackground();
        }
        ImVec2::ImVec2(&local_90,local_64,(pIVar2->DC).CursorPos.y);
        ImVec2::ImVec2(&local_98,local_68,(pIVar2->DC).CursorPos.y + local_1c);
        ImRect::ImRect((ImRect *)&stack0xffffffffffffff78,&local_90,&local_98);
        ImVec2::ImVec2(&local_a0,0.0,local_20);
        ItemSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (float)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        bVar1 = ItemAdd((ImRect *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                        (ImGuiID)in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,
                        (ImGuiItemFlags)((ulong)pIVar5 >> 0x20));
        if (bVar1) {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff54,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff7c);
          GetColorU32((ImGuiCol)((ulong)pIVar5 >> 0x20),SUB84(pIVar5,0));
          ImDrawList::AddLine((ImDrawList *)this,(ImVec2 *)p1,
                              (ImVec2 *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (ImU32)in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
          if ((local_18->LogEnabled & 1U) != 0) {
            LogRenderedText((ImVec2 *)in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                            (char *)in_stack_ffffffffffffffb0);
          }
        }
        if (p1 != (ImGuiOldColumns *)0x0) {
          PopColumnsBackground();
          p1->LineMinY = (pIVar2->DC).CursorPos.y;
        }
      }
    }
    else {
      local_24 = (pIVar2->DC).CursorPos.y;
      local_28 = (pIVar2->DC).CursorPos.y + (pIVar2->DC).CurrLineSize.y;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc0,(pIVar2->DC).CursorPos.x,local_24);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb8,(pIVar2->DC).CursorPos.x + local_1c,local_28
                    );
      ImRect::ImRect(&local_38,(ImVec2 *)&stack0xffffffffffffffc0,(ImVec2 *)&stack0xffffffffffffffb8
                    );
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb0,local_20,0.0);
      ItemSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (float)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      bVar1 = ItemAdd((ImRect *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                      (ImGuiID)in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,
                      (ImGuiItemFlags)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      if (bVar1) {
        ImVec2::ImVec2(&local_58,local_38.Min.x,local_38.Min.y);
        ImVec2::ImVec2(&local_60,local_38.Min.x,local_38.Max.y);
        GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                    (float)in_stack_ffffffffffffff40);
        ImDrawList::AddLine(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                            (ImVec2 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            (ImU32)in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
        if ((local_18->LogEnabled & 1U) != 0) {
          LogText(" |");
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::SeparatorEx(ImGuiSeparatorFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    IM_ASSERT(ImIsPowerOfTwo(flags & (ImGuiSeparatorFlags_Horizontal | ImGuiSeparatorFlags_Vertical)));   // Check that only 1 option is selected

    float thickness_draw = 1.0f;
    float thickness_layout = 0.0f;
    if (flags & ImGuiSeparatorFlags_Vertical)
    {
        // Vertical separator, for menu bars (use current line height). Not exposed because it is misleading and it doesn't have an effect on regular layout.
        float y1 = window->DC.CursorPos.y;
        float y2 = window->DC.CursorPos.y + window->DC.CurrLineSize.y;
        const ImRect bb(ImVec2(window->DC.CursorPos.x, y1), ImVec2(window->DC.CursorPos.x + thickness_draw, y2));
        ItemSize(ImVec2(thickness_layout, 0.0f));
        if (!ItemAdd(bb, 0))
            return;

        // Draw
        window->DrawList->AddLine(ImVec2(bb.Min.x, bb.Min.y), ImVec2(bb.Min.x, bb.Max.y), GetColorU32(ImGuiCol_Separator));
        if (g.LogEnabled)
            LogText(" |");
    }
    else if (flags & ImGuiSeparatorFlags_Horizontal)
    {
        // Horizontal Separator
        float x1 = window->Pos.x;
        float x2 = window->Pos.x + window->Size.x;

        // FIXME-WORKRECT: old hack (#205) until we decide of consistent behavior with WorkRect/Indent and Separator
        if (g.GroupStack.Size > 0 && g.GroupStack.back().WindowID == window->ID)
            x1 += window->DC.Indent.x;

        // FIXME-WORKRECT: In theory we should simply be using WorkRect.Min.x/Max.x everywhere but it isn't aesthetically what we want,
        // need to introduce a variant of WorkRect for that purpose. (#4787)
        if (ImGuiTable* table = g.CurrentTable)
        {
            x1 = table->Columns[table->CurrentColumn].MinX;
            x2 = table->Columns[table->CurrentColumn].MaxX;
        }

        ImGuiOldColumns* columns = (flags & ImGuiSeparatorFlags_SpanAllColumns) ? window->DC.CurrentColumns : NULL;
        if (columns)
            PushColumnsBackground();

        // We don't provide our width to the layout so that it doesn't get feed back into AutoFit
        // FIXME: This prevents ->CursorMaxPos based bounding box evaluation from working (e.g. TableEndCell)
        const ImRect bb(ImVec2(x1, window->DC.CursorPos.y), ImVec2(x2, window->DC.CursorPos.y + thickness_draw));
        ItemSize(ImVec2(0.0f, thickness_layout));
        const bool item_visible = ItemAdd(bb, 0);
        if (item_visible)
        {
            // Draw
            window->DrawList->AddLine(bb.Min, ImVec2(bb.Max.x, bb.Min.y), GetColorU32(ImGuiCol_Separator));
            if (g.LogEnabled)
                LogRenderedText(&bb.Min, "--------------------------------\n");

        }
        if (columns)
        {
            PopColumnsBackground();
            columns->LineMinY = window->DC.CursorPos.y;
        }
    }
}